

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(XMLGrammarPoolImpl *this,MemoryManager *memMgr)

{
  XMLSize_t XVar1;
  int iVar2;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *pRVar3;
  undefined4 extraout_var;
  XMLStringPool *this_00;
  XMLSize_t XVar4;
  
  (this->super_XMLGrammarPool).fMemMgr = memMgr;
  (this->super_XMLGrammarPool).fIgnoreSerializedAnnotations = false;
  (this->super_XMLGrammarPool)._vptr_XMLGrammarPool =
       (_func_int **)&PTR__XMLGrammarPoolImpl_004149f0;
  this->fGrammarRegistry = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)0x0;
  this->fStringPool = (XMLStringPool *)0x0;
  this->fSynchronizedStringPool = (XMLSynchronizedStringPool *)0x0;
  this->fXSModel = (XSModel *)0x0;
  this->fLocked = false;
  this->fXSModelIsValid = false;
  pRVar3 = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x38,memMgr);
  pRVar3->fMemoryManager = memMgr;
  pRVar3->fAdoptedElems = true;
  pRVar3->fBucketList = (RefHashTableBucketElem<xercesc_4_0::Grammar> **)0x0;
  pRVar3->fHashModulus = 0x1d;
  pRVar3->fInitialModulus = 0x1d;
  pRVar3->fCount = 0;
  iVar2 = (*memMgr->_vptr_MemoryManager[3])(memMgr,0xe8);
  pRVar3->fBucketList =
       (RefHashTableBucketElem<xercesc_4_0::Grammar> **)CONCAT44(extraout_var,iVar2);
  XVar1 = pRVar3->fHashModulus;
  if (XVar1 != 0) {
    XVar4 = 0;
    do {
      pRVar3->fBucketList[XVar4] = (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0;
      XVar4 = XVar4 + 1;
    } while (XVar1 != XVar4);
  }
  this->fGrammarRegistry = pRVar3;
  this_00 = (XMLStringPool *)XMemory::operator_new(0x28,memMgr);
  XMLStringPool::XMLStringPool(this_00,0x6d,memMgr);
  this->fStringPool = this_00;
  return;
}

Assistant:

XMLGrammarPoolImpl::XMLGrammarPoolImpl(MemoryManager* const memMgr)
:XMLGrammarPool(memMgr)
,fGrammarRegistry(0)
,fStringPool(0)
,fSynchronizedStringPool(0)
,fXSModel(0)
,fLocked(false)
,fXSModelIsValid(false)
{
    fGrammarRegistry = new (memMgr) RefHashTableOf<Grammar>(29, true, memMgr);
    fStringPool = new (memMgr) XMLStringPool(109, memMgr);
}